

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::FileDescriptorStream::flush(FileDescriptorStream *this)

{
  _func_int *p_Var1;
  int iVar2;
  int *piVar3;
  FileDescriptorStream *this_local;
  
  if (-1 < (this->super_DisconnectableStream).super_SelectableStream.fd) {
    iVar2 = fdatasync((this->super_DisconnectableStream).super_SelectableStream.fd);
    if (iVar2 < 0) {
      p_Var1 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[-3];
      piVar3 = __errno_location();
      Stream::fail((Stream *)
                   ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream + (long)p_Var1),IOError,*piVar3,
                   "File flush error.");
    }
    return;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                ,0x32f,"virtual void Dashel::FileDescriptorStream::flush()");
}

Assistant:

virtual void flush()
		{
			assert(fd >= 0);

#ifdef MACOSX
			if (fsync(fd) < 0)
#else
			if (fdatasync(fd) < 0)
#endif
			{
				fail(DashelException::IOError, errno, "File flush error.");
			}
		}